

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionDispatcherMt.cpp
# Opt level: O2

void __thiscall
cbtCollisionDispatcherMt::dispatchAllCollisionPairs
          (cbtCollisionDispatcherMt *this,cbtOverlappingPairCache *pairCache,cbtDispatcherInfo *info
          ,cbtDispatcher *dispatcher)

{
  cbtAlignedObjectArray<cbtPersistentManifold_*> *this_00;
  long *plVar1;
  cbtPersistentManifold **ppcVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar5;
  long lVar6;
  cbtIParallelForBody local_58;
  undefined8 local_50;
  cbtNearCallback local_48;
  cbtCollisionDispatcherMt *local_40;
  cbtDispatcherInfo *local_38;
  
  uVar3 = (*(pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback[9])
                    (pairCache);
  if (uVar3 != 0) {
    local_58._vptr_cbtIParallelForBody = (_func_int **)&PTR__cbtIParallelForBody_01193b60;
    local_48 = (this->super_cbtCollisionDispatcher).m_nearCallback;
    iVar4 = (*(pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback[5])();
    local_50 = CONCAT44(extraout_var,iVar4);
    this->m_batchUpdating = true;
    local_40 = this;
    local_38 = info;
    cbtParallelFor(0,uVar3,this->m_grainSize,&local_58);
    this_00 = &(this->super_cbtCollisionDispatcher).m_manifoldsPtr;
    this->m_batchUpdating = false;
    cbtAlignedObjectArray<cbtPersistentManifold_*>::resizeNoInitialize(this_00,0);
    iVar4 = (*(pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback[5])
                      (pairCache);
    for (lVar6 = 0; (ulong)(~((int)uVar3 >> 0x1f) & uVar3) << 5 != lVar6; lVar6 = lVar6 + 0x20) {
      plVar1 = *(long **)(CONCAT44(extraout_var_00,iVar4) + 0x10 + lVar6);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x20))(plVar1,this_00);
      }
    }
    uVar3 = (this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_size;
    ppcVar2 = (this->super_cbtCollisionDispatcher).m_manifoldsPtr.m_data;
    for (uVar5 = 0; (~((int)uVar3 >> 0x1f) & uVar3) != uVar5; uVar5 = uVar5 + 1) {
      ppcVar2[uVar5]->m_index1a = (int)uVar5;
    }
  }
  return;
}

Assistant:

void cbtCollisionDispatcherMt::dispatchAllCollisionPairs(cbtOverlappingPairCache* pairCache, const cbtDispatcherInfo& info, cbtDispatcher* dispatcher)
{
	int pairCount = pairCache->getNumOverlappingPairs();
	if (pairCount == 0)
	{
		return;
	}
	CollisionDispatcherUpdater updater;
	updater.mCallback = getNearCallback();
	updater.mPairArray = pairCache->getOverlappingPairArrayPtr();
	updater.mDispatcher = this;
	updater.mInfo = &info;

	m_batchUpdating = true;
	cbtParallelFor(0, pairCount, m_grainSize, updater);
	m_batchUpdating = false;

	// reconstruct the manifolds array to ensure determinism
	m_manifoldsPtr.resizeNoInitialize(0);

	cbtBroadphasePair* pairs = pairCache->getOverlappingPairArrayPtr();
	for (int i = 0; i < pairCount; ++i)
	{
		if (cbtCollisionAlgorithm* algo = pairs[i].m_algorithm)
		{
			algo->getAllContactManifolds(m_manifoldsPtr);
		}
	}

	// update the indices (used when releasing manifolds)
	for (int i = 0; i < m_manifoldsPtr.size(); ++i)
	{
		m_manifoldsPtr[i]->m_index1a = i;
	}
}